

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

AssimpVertexBoneWeightList * __thiscall
Assimp::Ogre::IVertexData::AssimpBoneWeights
          (AssimpVertexBoneWeightList *__return_storage_ptr__,IVertexData *this,size_t vertices)

{
  _Rb_tree_header *p_Var1;
  pointer *ppaVar2;
  pointer pVVar3;
  iterator __position;
  aiVertexWeight aVar4;
  mapped_type *pmVar5;
  mapped_type *this_00;
  uint16_t *__k;
  pointer pVVar6;
  uint uVar7;
  size_t sVar8;
  aiVertexWeight local_48;
  uint local_3c;
  VertexBoneAssignmentsMap *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (vertices != 0) {
    local_38 = &this->boneAssignmentsMap;
    sVar8 = 0;
    do {
      uVar7 = (uint)sVar8;
      local_3c = uVar7;
      pmVar5 = std::
               map<unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>_>
               ::operator[](local_38,&local_3c);
      pVVar6 = (pmVar5->
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (pmVar5->
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pVVar6 != pVVar3) {
        __k = &pVVar6->boneIndex;
        do {
          this_00 = std::
                    map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                    ::operator[](__return_storage_ptr__,__k);
          local_48.mWeight = *(float *)(__k + 2);
          __position._M_current =
               (this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          local_48.mVertexId = uVar7;
          if (__position._M_current ==
              (this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
            _M_realloc_insert<aiVertexWeight>(this_00,__position,&local_48);
          }
          else {
            aVar4.mWeight = local_48.mWeight;
            aVar4.mVertexId = uVar7;
            *__position._M_current = aVar4;
            ppaVar2 = &(this_00->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
          pVVar6 = (pointer)(__k + 4);
          __k = __k + 6;
        } while (pVVar6 != pVVar3);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != vertices);
  }
  return __return_storage_ptr__;
}

Assistant:

AssimpVertexBoneWeightList IVertexData::AssimpBoneWeights(size_t vertices)
{
    AssimpVertexBoneWeightList weights;
    for(size_t vi=0; vi<vertices; ++vi)
    {
        VertexBoneAssignmentList &vertexWeights = boneAssignmentsMap[static_cast<unsigned int>(vi)];
        for (VertexBoneAssignmentList::const_iterator iter=vertexWeights.begin(), end=vertexWeights.end();
            iter!=end; ++iter)
        {
            std::vector<aiVertexWeight> &boneWeights = weights[iter->boneIndex];
            boneWeights.push_back(aiVertexWeight(static_cast<unsigned int>(vi), iter->weight));
        }
    }
    return weights;
}